

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dct.cc
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  ostream *poVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  ifstream *input_stream;
  int dct_length;
  allocator local_4c1;
  uint local_4c0;
  uint local_4bc;
  string local_4b8;
  vector<double,_std::allocator<double>_> output_y;
  vector<double,_std::allocator<double>_> output_x;
  DiscreteCosineTransform discrete_cosine_transform;
  vector<double,_std::allocator<double>_> input_x;
  Buffer buffer;
  vector<double,_std::allocator<double>_> input_y;
  ostringstream error_message_5;
  ifstream ifs;
  byte abStack_218 [488];
  
  dct_length = 0x100;
  local_4c0 = 1;
  uVar1 = 1;
LAB_00103639:
  local_4bc = uVar1;
  iVar5 = ya_getopt_long(argc,argv,"l:q:o:h",(option *)0x0,(int *)0x0);
  switch(iVar5) {
  case 0x68:
    anon_unknown.dwarf_2efa::PrintUsage((ostream *)&std::cout);
    return 0;
  case 0x6c:
    std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_5);
    bVar2 = sptk::ConvertStringToInteger((string *)&ifs,&dct_length);
    bVar3 = dct_length < 1;
    std::__cxx11::string::~string((string *)&ifs);
    uVar1 = local_4bc;
    if (!bVar2 || bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      std::operator<<((ostream *)&ifs,"The argument for the -l option must be a positive integer");
      std::__cxx11::string::string
                ((string *)&error_message_5,"dct",(allocator *)&discrete_cosine_transform);
      sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
      goto LAB_00103838;
    }
    goto LAB_00103639;
  case 0x6f:
    std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_5);
    bVar3 = sptk::ConvertStringToInteger((string *)&ifs,(int *)&discrete_cosine_transform);
    if (bVar3) break;
    std::__cxx11::string::~string((string *)&ifs);
    goto LAB_00103cad;
  case 0x71:
    goto switchD_00103662_caseD_71;
  default:
    if (iVar5 == -1) {
      if (1 < argc - ya_optind) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"Too many input files");
        std::__cxx11::string::string
                  ((string *)&error_message_5,"dct",(allocator *)&discrete_cosine_transform);
        sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
        goto LAB_00103838;
      }
      if (argc == ya_optind) {
        pcVar8 = (char *)0x0;
      }
      else {
        pcVar8 = argv[ya_optind];
      }
      bVar3 = sptk::SetBinaryMode();
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"Cannot set translation mode");
        std::__cxx11::string::string
                  ((string *)&error_message_5,"dct",(allocator *)&discrete_cosine_transform);
        sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
        goto LAB_00103838;
      }
      input_stream = &ifs;
      std::ifstream::ifstream(input_stream);
      if ((pcVar8 != (char *)0x0) &&
         (std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar8),
         (abStack_218[*(long *)(_ifs + -0x18)] & 5) != 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
        poVar6 = std::operator<<((ostream *)&error_message_5,"Cannot open file ");
        std::operator<<(poVar6,pcVar8);
        std::__cxx11::string::string
                  ((string *)&discrete_cosine_transform,"dct",(allocator *)&buffer);
        sptk::PrintErrorMessage((string *)&discrete_cosine_transform,&error_message_5);
        std::__cxx11::string::~string((string *)&discrete_cosine_transform);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_5);
        iVar5 = 1;
        goto LAB_00103edc;
      }
      cVar4 = std::__basic_file<char>::is_open();
      if (cVar4 == '\0') {
        input_stream = (ifstream *)&std::cin;
      }
      sptk::DiscreteCosineTransform::DiscreteCosineTransform(&discrete_cosine_transform,dct_length);
      buffer._vptr_Buffer = (_func_int **)&PTR__Buffer_00111b50;
      buffer.fourier_transform_real_part_.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      buffer.fourier_transform_real_part_.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      buffer.fourier_transform_real_part_.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      buffer.fourier_transform_imag_part_.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      buffer.fourier_transform_imag_part_.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      buffer.fourier_transform_imag_part_.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      iVar5 = (*(discrete_cosine_transform.fourier_transform_.fourier_transform_)->
                _vptr_FourierTransformInterface[3])();
      if ((char)iVar5 == '\0') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
        std::operator<<((ostream *)&error_message_5,"Failed to initialize DiscreteCosineTransform");
        std::__cxx11::string::string((string *)&local_4b8,"dct",(allocator *)&input_x);
        sptk::PrintErrorMessage(&local_4b8,&error_message_5);
        std::__cxx11::string::~string((string *)&local_4b8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_5);
        iVar5 = 1;
        goto LAB_00103ec5;
      }
      std::vector<double,_std::allocator<double>_>::vector
                (&input_x,(long)dct_length,(allocator_type *)&error_message_5);
      std::vector<double,_std::allocator<double>_>::vector
                (&input_y,(long)dct_length,(allocator_type *)&error_message_5);
      std::vector<double,_std::allocator<double>_>::vector
                (&output_x,(long)dct_length,(allocator_type *)&error_message_5);
      std::vector<double,_std::allocator<double>_>::vector
                (&output_y,(long)dct_length,(allocator_type *)&error_message_5);
      iVar5 = 0;
      goto LAB_00103a7c;
    }
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6d:
  case 0x6e:
  case 0x70:
    anon_unknown.dwarf_2efa::PrintUsage((ostream *)&std::cerr);
    return 1;
  }
  bVar3 = sptk::IsInRange((uint)discrete_cosine_transform._vptr_DiscreteCosineTransform,0,4);
  std::__cxx11::string::~string((string *)&ifs);
  uVar1 = (uint)discrete_cosine_transform._vptr_DiscreteCosineTransform;
  if (!bVar3) {
LAB_00103cad:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    poVar6 = std::operator<<((ostream *)&ifs,"The argument for the -o option must be an integer ");
    poVar6 = std::operator<<(poVar6,"in the range of ");
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0);
    poVar6 = std::operator<<(poVar6," to ");
    std::ostream::operator<<((ostream *)poVar6,4);
    std::__cxx11::string::string((string *)&error_message_5,"dct",(allocator *)&buffer);
    sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
LAB_00103838:
    std::__cxx11::string::~string((string *)&error_message_5);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
    return 1;
  }
  goto LAB_00103639;
switchD_00103662_caseD_71:
  std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_5);
  bVar3 = sptk::ConvertStringToInteger((string *)&ifs,(int *)&discrete_cosine_transform);
  if (bVar3) {
    bVar3 = sptk::IsInRange((uint)discrete_cosine_transform._vptr_DiscreteCosineTransform,0,1);
    std::__cxx11::string::~string((string *)&ifs);
    if (bVar3) {
      local_4c0 = (uint)discrete_cosine_transform._vptr_DiscreteCosineTransform;
      uVar1 = local_4bc;
      goto LAB_00103639;
    }
  }
  else {
    std::__cxx11::string::~string((string *)&ifs);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
  poVar6 = std::operator<<((ostream *)&ifs,"The argument for the -q option must be an integer ");
  poVar6 = std::operator<<(poVar6,"in the range of ");
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0);
  poVar6 = std::operator<<(poVar6," to ");
  std::ostream::operator<<((ostream *)poVar6,1);
  std::__cxx11::string::string((string *)&error_message_5,"dct",(allocator *)&buffer);
  sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
  std::__cxx11::string::~string((string *)&error_message_5);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
  return 1;
LAB_00103a7c:
  do {
    bVar3 = sptk::ReadStream<double>
                      (true,0,0,dct_length,&input_x,(istream *)input_stream,(int *)0x0);
    if ((!bVar3) ||
       ((local_4c0 == 0 &&
        (bVar3 = sptk::ReadStream<double>
                           (true,0,0,dct_length,&input_y,(istream *)input_stream,(int *)0x0), !bVar3
        )))) goto LAB_00103e97;
    bVar3 = sptk::DiscreteCosineTransform::Run
                      (&discrete_cosine_transform,&input_x,&input_y,&output_x,&output_y,&buffer);
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
      std::operator<<((ostream *)&error_message_5,"Failed to run discrete cosine transform");
      std::__cxx11::string::string((string *)&local_4b8,"dct",&local_4c1);
      sptk::PrintErrorMessage(&local_4b8,&error_message_5);
      goto LAB_00103e7c;
    }
    if (local_4bc < 2) {
LAB_00103b96:
      bVar3 = sptk::WriteStream<double>(0,dct_length,&output_x,(ostream *)&std::cout,(int *)0x0);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
        std::operator<<((ostream *)&error_message_5,"Failed to write output sequence");
        std::__cxx11::string::string((string *)&local_4b8,"dct",&local_4c1);
        sptk::PrintErrorMessage(&local_4b8,&error_message_5);
        goto LAB_00103e7c;
      }
    }
    else if (local_4bc == 3) {
      uVar7 = (ulong)(uint)dct_length;
      if (dct_length < 1) {
        uVar7 = 0;
      }
      for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
        output_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar9] =
             SQRT(output_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar9] *
                  output_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar9] +
                  output_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar9] *
                  output_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar9]);
      }
LAB_00103b8c:
      if ((local_4bc < 5) && (local_4bc != 2)) goto LAB_00103b96;
    }
    else if (local_4bc == 4) {
      uVar7 = (ulong)(uint)dct_length;
      if (dct_length < 1) {
        uVar7 = 0;
      }
      for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
        output_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar9] =
             output_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar9] *
             output_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar9] +
             output_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar9] *
             output_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar9];
      }
      goto LAB_00103b8c;
    }
  } while (((local_4bc & 0xfffffffd) != 0) ||
          (bVar3 = sptk::WriteStream<double>
                             (0,dct_length,&output_y,(ostream *)&std::cout,(int *)0x0), bVar3));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
  std::operator<<((ostream *)&error_message_5,"Failed to write imaginary parts");
  std::__cxx11::string::string((string *)&local_4b8,"dct",&local_4c1);
  sptk::PrintErrorMessage(&local_4b8,&error_message_5);
LAB_00103e7c:
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_5);
  iVar5 = 1;
LAB_00103e97:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&output_y.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&output_x.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&input_y.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&input_x.super__Vector_base<double,_std::allocator<double>_>);
LAB_00103ec5:
  sptk::DiscreteCosineTransform::Buffer::~Buffer(&buffer);
  sptk::DiscreteCosineTransform::~DiscreteCosineTransform(&discrete_cosine_transform);
LAB_00103edc:
  std::ifstream::~ifstream(&ifs);
  return iVar5;
}

Assistant:

int main(int argc, char* argv[]) {
  int dct_length(kDefaultDctLength);
  InputFormats input_format(kDefaultInputFormat);
  OutputFormats output_format(kDefaultOutputFormat);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:q:o:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &dct_length) ||
            dct_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("dct", error_message);
          return 1;
        }
        break;
      }
      case 'q': {
        const int min(0);
        const int max(static_cast<int>(kNumInputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -q option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("dct", error_message);
          return 1;
        }
        input_format = static_cast<InputFormats>(tmp);
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("dct", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("dct", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("dct", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("dct", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::DiscreteCosineTransform discrete_cosine_transform(dct_length);
  sptk::DiscreteCosineTransform::Buffer buffer;
  if (!discrete_cosine_transform.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize DiscreteCosineTransform";
    sptk::PrintErrorMessage("dct", error_message);
    return 1;
  }

  std::vector<double> input_x(dct_length);
  std::vector<double> input_y(dct_length);
  std::vector<double> output_x(dct_length);
  std::vector<double> output_y(dct_length);

  while (
      sptk::ReadStream(true, 0, 0, dct_length, &input_x, &input_stream, NULL)) {
    if (kInputRealAndImagParts == input_format &&
        !sptk::ReadStream(true, 0, 0, dct_length, &input_y, &input_stream,
                          NULL)) {
      break;
    }

    if (!discrete_cosine_transform.Run(input_x, input_y, &output_x, &output_y,
                                       &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to run discrete cosine transform";
      sptk::PrintErrorMessage("dct", error_message);
      return 1;
    }

    if (kOutputAmplitude == output_format) {
      for (int i(0); i < dct_length; ++i) {
        output_x[i] =
            std::sqrt(output_x[i] * output_x[i] + output_y[i] * output_y[i]);
      }
    } else if (kOutputPower == output_format) {
      for (int i(0); i < dct_length; ++i) {
        output_x[i] = output_x[i] * output_x[i] + output_y[i] * output_y[i];
      }
    }

    if ((kOutputRealAndImagParts == output_format ||
         kOutputRealPart == output_format ||
         kOutputAmplitude == output_format || kOutputPower == output_format) &&
        !sptk::WriteStream(0, dct_length, output_x, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write output sequence";
      sptk::PrintErrorMessage("dct", error_message);
      return 1;
    }

    if ((kOutputRealAndImagParts == output_format ||
         kOutputImagPart == output_format) &&
        !sptk::WriteStream(0, dct_length, output_y, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write imaginary parts";
      sptk::PrintErrorMessage("dct", error_message);
      return 1;
    }
  }

  return 0;
}